

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueType.cpp
# Opt level: O2

void __thiscall ValueType::ToString(ValueType *this,char (*str) [256])

{
  bool b;
  bool bVar1;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar2;
  ValueType VVar3;
  anon_union_2_4_ea848c7b_for_ValueType_13 valueType;
  Type TVar4;
  undefined8 in_RAX;
  char *pcVar5;
  char *_Src;
  undefined8 local_38;
  ValueType definiteType;
  ValueType generalizedType;
  
  if ((((this->field_0).bits & ~CanBeTaggedValue) == Likely) || (DAT_0145948a == '\x01')) {
    ToVerboseString(this,str);
    return;
  }
  local_38 = in_RAX;
  b = CanBeTaggedValue(this);
  aVar2.field_0 =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)ToDefinite(this);
  local_38._0_6_ = CONCAT24(aVar2.bits,(undefined4)local_38);
  ValueType((ValueType *)((long)&local_38 + 6));
  if (((ushort)aVar2 & 0xff37) != 0x20) {
    if (((ushort)aVar2 & 0xfd17) == 0x100) {
      local_38 = CONCAT26(0x108,(undefined6)local_38);
      goto LAB_009f4fb3;
    }
    bVar1 = IsNumber((ValueType *)((long)&local_38 + 4));
    if (!bVar1) {
      TVar4 = aVar2.bits & ~CanBeTaggedValue;
      if (TVar4 == Symbol) {
        local_38 = CONCAT26(0x1000,(undefined6)local_38);
      }
      else if (TVar4 == Null) {
        local_38 = CONCAT26(4,(undefined6)local_38);
      }
      else if (TVar4 == Boolean) {
        local_38 = CONCAT26(0x400,(undefined6)local_38);
      }
      else if (TVar4 == String) {
        local_38 = CONCAT26(0x800,(undefined6)local_38);
      }
      else {
        if (TVar4 != Undefined) {
          bVar1 = IsPrimitive((ValueType *)((long)&local_38 + 4));
          if ((bVar1) && (TVar4 = (this->field_0).bits, (TVar4 & Object) == 0)) {
            pcVar5 = "Primitive";
            _Src = "LikelyPrimitive";
          }
          else {
            if (((ushort)aVar2 & 0x10) != 0) {
              VVar3 = ToDefiniteObject((ValueType *)((long)&local_38 + 4));
              local_38 = CONCAT26(VVar3.field_0,(undefined6)local_38);
              if (((ushort)aVar2 & 0x17) != 0x10) {
                VVar3 = ToLikely((ValueType *)((long)&local_38 + 6));
                local_38 = CONCAT26(VVar3.field_0,(undefined6)local_38);
              }
              goto LAB_009f4fb3;
            }
            TVar4 = (this->field_0).bits;
            pcVar5 = "Mixed";
            _Src = "LikelyMixed";
          }
          if ((TVar4 & Likely) == 0) {
            _Src = pcVar5;
          }
          strcpy_s<256ul>(str,_Src);
          return;
        }
        local_38 = CONCAT26(2,(undefined6)local_38);
      }
      goto LAB_009f4fb3;
    }
    local_38 = CONCAT26(0x208,(undefined6)local_38);
    if (((ushort)aVar2 & 0xfd36) != 0x20) goto LAB_009f4fb3;
    valueType.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         GetInt(((ushort)aVar2 & 0xa8) == 0x28);
    Verify(local_38._6_2_);
    Verify((ValueType)valueType.field_0);
    aVar2.field_0 = valueType.field_0;
    if (local_38._6_2_ != (anon_union_2_4_ea848c7b_for_ValueType_13)valueType.bits) {
      ValueType((ValueType *)&local_38,(ushort)local_38._6_2_ | valueType.bits);
      aVar2.bits = local_38._0_2_;
      if ((local_38 & 0x10) == 0) {
        Verify((ValueType)local_38._0_2_);
      }
      else {
        aVar2.field_0 =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             MergeWithObject((ValueType *)((long)&local_38 + 6),(ValueType)valueType.field_0);
      }
    }
  }
  local_38 = CONCAT26(aVar2.bits,(undefined6)local_38);
LAB_009f4fb3:
  if (((ushort)this->field_0 & 1) != 0) {
    VVar3 = ToLikely((ValueType *)((long)&local_38 + 6));
    local_38 = CONCAT26(VVar3.field_0,(undefined6)local_38);
  }
  VVar3 = SetCanBeTaggedValue((ValueType *)((long)&local_38 + 6),b);
  local_38._0_4_ = CONCAT22(VVar3.field_0,local_38._0_2_);
  ToVerboseString((ValueType *)((long)&local_38 + 2),str);
  return;
}

Assistant:

void ValueType::ToString(char (&str)[VALUE_TYPE_MAX_STRING_SIZE]) const
{
    if(IsUninitialized() || CONFIG_FLAG(Verbose))
    {
        ToVerboseString(str);
        return;
    }

    bool canBeTaggedValue = CanBeTaggedValue();
    const ValueType definiteType = ToDefinite();
    ValueType generalizedType;
    if(definiteType.IsInt())
        generalizedType = definiteType;
    else if(definiteType.IsFloat())
        generalizedType = Float;
    else if(definiteType.IsNumber())
    {
        generalizedType = Number;
        if(definiteType.IsLikelyInt())
            generalizedType = generalizedType.Merge(GetInt(definiteType.IsLikelyTaggedInt()));
    }
    else if(definiteType.IsUndefined())
        generalizedType = Undefined;
    else if(definiteType.IsNull())
        generalizedType = Null;
    else if(definiteType.IsBoolean())
        generalizedType = Boolean;
    else if (definiteType.IsString())
        generalizedType = String;
    else if (definiteType.IsSymbol())
        generalizedType = Symbol;
    else if(definiteType.IsPrimitive() && !IsLikelyObject())
    {
        strcpy_s(str, IsDefinite() ? "Primitive" : "LikelyPrimitive");
        return;
    }
    else if(definiteType.IsLikelyObject())
    {
        generalizedType = definiteType.ToDefiniteObject();
        if(!definiteType.IsObject())
            generalizedType = generalizedType.ToLikely();
    }
    else
    {
        strcpy_s(str, IsDefinite() ? "Mixed" : "LikelyMixed");
        return;
    }

    if(!IsDefinite())
        generalizedType = generalizedType.ToLikely();
    generalizedType.SetCanBeTaggedValue(canBeTaggedValue).ToVerboseString(str);
}